

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O3

void __thiscall JetHead::list<Event_*>::list(list<Event_*> *this)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0x37);
  this->mHead = pNVar1;
  pNVar2 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0x38);
  this->mTail = pNVar2;
  pNVar1 = this->mHead;
  pNVar1->next = pNVar2;
  pNVar1->prev = (Node *)0x0;
  pNVar2->prev = pNVar1;
  pNVar2->next = (Node *)0x0;
  return;
}

Assistant:

list()
			: mHead(jh_new Node),
			  mTail(jh_new Node)
		{ 
			mHead->next = mTail;
			mHead->prev = NULL;
			mTail->prev = mHead;
			mTail->next = NULL;
		}